

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O1

genxStatus genxStartDocFile(genxWriter w,FILE *file)

{
  if (w->sequence != SEQUENCE_NO_DOC) {
    w->status = GENX_SEQUENCE_ERROR;
    return GENX_SEQUENCE_ERROR;
  }
  w->sequence = SEQUENCE_PRE_DOC;
  w->file = file;
  w->sender = (genxSender *)0x0;
  return GENX_SUCCESS;
}

Assistant:

genxStatus genxStartDocFile(genxWriter w, FILE * file)
{
  if (w->sequence != SEQUENCE_NO_DOC)
    return w->status = GENX_SEQUENCE_ERROR;
  
  w->sequence = SEQUENCE_PRE_DOC;
  w->file = file;
  w->sender = NULL;
  return GENX_SUCCESS;
}